

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

uint32_t xor_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                     uint16_t *output)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  int32_t card_2;
  int iVar5;
  uint16_t *array_2;
  uint uVar6;
  ushort uVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  long lVar10;
  uint16_t uVar11;
  int iVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined1 (*out) [16];
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM3 [64];
  uint16_t buffer [17];
  undefined8 local_70;
  undefined1 local_68 [3] [16];
  ulong local_38;
  
  local_70 = CONCAT44(in_register_00000034,length1);
  if (length1 < 8 || length2 < 8) {
    uVar4 = xor_uint16(array1,length1,array2,length2,output);
    return uVar4;
  }
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])array1);
  auVar19 = vlddqu_avx(*(undefined1 (*) [16])array2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar19 = vpmaxuw_avx(auVar1,auVar19);
  auVar1 = vpalignr_avx(auVar18,auVar18,2);
  auVar18 = vpminuw_avx(auVar1,auVar19);
  auVar17 = vpmaxuw_avx(auVar1,auVar19);
  auVar18 = vpalignr_avx(auVar18,auVar18,2);
  auVar19 = vpshufd_avx(auVar18,0x90);
  auVar1 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
  auVar3 = vpblendd_avx2(auVar19,auVar1,1);
  auVar19 = vpalignr_avx(auVar18,auVar1,0xe);
  auVar1 = vpcmpeqw_avx(auVar19,auVar3);
  auVar3 = vpcmpeqw_avx(auVar19,auVar18);
  auVar1 = vpor_avx(auVar1,auVar3);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar7 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar7 * 0x10));
  auVar1 = vpshufb_avx(auVar19,auVar1);
  *(undefined1 (*) [16])output = auVar1;
  out = (undefined1 (*) [16])(output + (8 - (ulong)(uint)POPCOUNT((uint)uVar7)));
  uVar6 = 1;
  if (0xf < length2 && 0xf < length1) {
    uVar7 = array1[8];
    uVar11 = array2[8];
    uVar6 = 1;
    uVar16 = 1;
    auVar1 = auVar18;
    do {
      uVar15 = (uint)uVar16;
      if (uVar11 < uVar7) {
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(array2 + uVar16 * 8));
        uVar15 = uVar15 + 1;
        uVar16 = (ulong)uVar15;
        if (length2 >> 3 <= uVar15) goto LAB_00105512;
        uVar11 = array2[uVar15 * 8];
      }
      else {
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(array1 + (ulong)uVar6 * 8));
        uVar6 = uVar6 + 1;
        if (length1 >> 3 <= uVar6) goto LAB_00105512;
        uVar7 = array1[uVar6 * 8];
      }
      auVar3 = vpminuw_avx(auVar19,auVar17);
      auVar18 = vpmaxuw_avx(auVar19,auVar17);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar18 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar3 = vpminuw_avx(auVar19,auVar18);
      auVar17 = vpmaxuw_avx(auVar19,auVar18);
      auVar19 = vpalignr_avx(auVar3,auVar3,2);
      auVar18 = vpalignr_avx(auVar19,auVar1,0xc);
      auVar3 = vpalignr_avx(auVar19,auVar1,0xe);
      auVar1 = vpcmpeqw_avx(auVar3,auVar18);
      auVar18 = vpcmpeqw_avx(auVar3,auVar19);
      auVar1 = vpor_avx(auVar1,auVar18);
      auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
      uVar2 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
      auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar2 * 0x10));
      auVar1 = vpshufb_avx(auVar3,auVar1);
      *out = auVar1;
      out = (undefined1 (*) [16])((long)out + (8 - (ulong)(uint)POPCOUNT((uint)uVar2)) * 2);
      auVar1 = auVar19;
    } while( true );
  }
  uVar15 = 8;
LAB_001055e5:
  local_38 = (ulong)((long)out - (long)output) >> 1;
  auVar19 = vpalignr_avx(auVar17,auVar18,0xe);
  auVar1 = vpalignr_avx(auVar17,auVar18,0xc);
  auVar1 = vpcmpeqw_avx(auVar1,auVar19);
  auVar18 = vpcmpeqw_avx(auVar17,auVar19);
  auVar1 = vpor_avx(auVar1,auVar18);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar7 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  iVar5 = POPCOUNT((uint)uVar7);
  iVar12 = 8 - iVar5;
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar7 * 0x10));
  local_68[0] = vpshufb_avx(auVar19,auVar1);
  uVar14 = vpextrw_avx(auVar17,7);
  uVar8 = vpextrw_avx(auVar17,6);
  if ((short)uVar14 != (short)uVar8) {
    lVar10 = (long)iVar12;
    iVar12 = 9 - iVar5;
    *(short *)(local_68[0] + lVar10 * 2) = (short)uVar14;
  }
  if (uVar6 == length1 >> 3) {
    memcpy(local_68[0] + (long)iVar12 * 2,array1 + (uVar6 << 3),(ulong)((length1 & 7) * 2));
    uVar6 = iVar12 + (length1 & 7);
    if (uVar6 == 0) {
      uVar9 = length2 - uVar15;
      memcpy(out,array2 + uVar15,(ulong)uVar9 * 2);
      goto LAB_001057cd;
    }
    qsort(local_68,(long)(int)uVar6,2,uint16_compare);
    uVar9 = 1;
    if (uVar6 != 1) {
      uVar16 = 1;
      do {
        if (*(short *)(local_68[0] + uVar16 * 2) == *(short *)(local_68[-1] + uVar16 * 2 + 0xe)) {
          uVar9 = uVar9 - 1;
        }
        else {
          uVar13 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          *(short *)(local_68[0] + uVar13 * 2) = *(short *)(local_68[0] + uVar16 * 2);
        }
        uVar16 = uVar16 + 1;
      } while (uVar6 != uVar16);
    }
    array_2 = array2 + uVar15;
    card_2 = length2 - uVar15;
  }
  else {
    memcpy(local_68[0] + (long)iVar12 * 2,array2 + uVar15,(ulong)((length2 & 7) * 2));
    uVar15 = iVar12 + (length2 & 7);
    if (uVar15 == 0) {
      uVar9 = (int)local_70 + uVar6 * -8;
      memcpy(out,array1 + uVar6 * 8,(ulong)uVar9 * 2);
      goto LAB_001057cd;
    }
    qsort(local_68,(long)(int)uVar15,2,uint16_compare);
    uVar9 = 1;
    if (uVar15 != 1) {
      uVar16 = 1;
      do {
        if (*(short *)(local_68[0] + uVar16 * 2) == *(short *)(local_68[-1] + uVar16 * 2 + 0xe)) {
          uVar9 = uVar9 - 1;
        }
        else {
          uVar13 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          *(short *)(local_68[0] + uVar13 * 2) = *(short *)(local_68[0] + uVar16 * 2);
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    array_2 = array1 + uVar6 * 8;
    card_2 = (int)local_70 + uVar6 * -8;
  }
  uVar9 = xor_uint16((uint16_t *)local_68,uVar9,array_2,card_2,(uint16_t *)out);
LAB_001057cd:
  return uVar9 + (int)local_38;
LAB_00105512:
  auVar3 = vpminuw_avx(auVar19,auVar17);
  auVar18 = vpmaxuw_avx(auVar19,auVar17);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar18 = vpmaxuw_avx(auVar19,auVar18);
  auVar19 = vpalignr_avx(auVar3,auVar3,2);
  auVar3 = vpminuw_avx(auVar19,auVar18);
  auVar17 = vpmaxuw_avx(auVar19,auVar18);
  auVar18 = vpalignr_avx(auVar3,auVar3,2);
  auVar19 = vpalignr_avx(auVar18,auVar1,0xc);
  auVar3 = vpalignr_avx(auVar18,auVar1,0xe);
  auVar1 = vpcmpeqw_avx(auVar3,auVar19);
  auVar19 = vpcmpeqw_avx(auVar3,auVar18);
  auVar1 = vpor_avx(auVar1,auVar19);
  auVar1 = vpacksswb_avx(auVar1,(undefined1  [16])0x0);
  uVar7 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (ulong)uVar7 * 0x10));
  auVar1 = vpshufb_avx(auVar3,auVar1);
  *out = auVar1;
  out = (undefined1 (*) [16])((long)out + (8 - (ulong)(uint)POPCOUNT((uint)uVar7)) * 2);
  uVar15 = uVar15 << 3;
  goto LAB_001055e5;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE xor algorithm
uint32_t xor_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                      const uint16_t *__restrict__ array2, uint32_t length2,
                      uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return xor_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    uint16_t buffer[17];
    output += store_unique_xor(laststore, vecMin, output);

    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            // conditionally stores the last value of laststore as well as all
            // but the
            // last value of vecMin
            output += store_unique_xor(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        // conditionally stores the last value of laststore as well as all but
        // the
        // last value of vecMin
        output += store_unique_xor(laststore, vecMin, output);
        laststore = vecMin;
    }
    uint32_t len = (uint32_t)(output - initoutput);

    // we finish the rest off using a scalar algorithm
    // could be improved?
    // conditionally stores the last value of laststore as well as all but the
    // last value of vecMax,
    // we store to "buffer"
    int leftoversize = store_unique_xor(laststore, vecMax, buffer);
    uint16_t vec7 = (uint16_t)_mm_extract_epi16(vecMax, 7);
    uint16_t vec6 = (uint16_t)_mm_extract_epi16(vecMax, 6);
    if (vec7 != vec6) buffer[leftoversize++] = vec7;
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array2 + 8 * pos2,
                   (length2 - 8 * pos2) * sizeof(uint16_t));
            len += (length2 - 8 * pos2);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array2 + 8 * pos2,
                              length2 - 8 * pos2, output);
        }
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array1 + 8 * pos1,
                   (length1 - 8 * pos1) * sizeof(uint16_t));
            len += (length1 - 8 * pos1);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array1 + 8 * pos1,
                              length1 - 8 * pos1, output);
        }
    }
    return len;
}